

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int AR30ToARGB(uint8_t *src_ar30,int src_stride_ar30,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height)

{
  int iVar1;
  bool bVar2;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_ar30 == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_ar30 = src_ar30 + ~height * src_stride_ar30;
      src_stride_ar30 = -src_stride_ar30;
    }
    if (width * 4 == dst_stride_argb && src_stride_ar30 == width * 4) {
      width = iVar1 * width;
      iVar1 = 1;
      src_stride_ar30 = 0;
      dst_stride_argb = 0;
    }
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      AR30ToARGBRow_C(src_ar30,dst_argb,width);
      src_ar30 = src_ar30 + src_stride_ar30;
      dst_argb = dst_argb + dst_stride_argb;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int AR30ToARGB(const uint8_t* src_ar30,
               int src_stride_ar30,
               uint8_t* dst_argb,
               int dst_stride_argb,
               int width,
               int height) {
  int y;
  if (!src_ar30 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_ar30 = src_ar30 + (height - 1) * src_stride_ar30;
    src_stride_ar30 = -src_stride_ar30;
  }
  // Coalesce rows.
  if (src_stride_ar30 == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_ar30 = dst_stride_argb = 0;
  }
  for (y = 0; y < height; ++y) {
    AR30ToARGBRow_C(src_ar30, dst_argb, width);
    src_ar30 += src_stride_ar30;
    dst_argb += dst_stride_argb;
  }
  return 0;
}